

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Room * newRoomFactory(itemLocation location,ItemTable *pTable)

{
  Room *this;
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  switch(location) {
  case THREE_KEY_ROOM:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"keyroom","");
    ThreeKeyRoom::ThreeKeyRoom((ThreeKeyRoom *)this,&local_b8,pTable,true);
    _Var1._M_p = local_b8._M_dataplus._M_p;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/main.cpp"
                  ,0xeb,"Room *newRoomFactory(itemLocation, ItemTable *)");
  case G_ROOM1_SIDE1:
  case G_ROOM1_SIDE2:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"greenRoomOne","");
    GreenRoomOne::GreenRoomOne((GreenRoomOne *)this,&local_38,pTable,true);
    _Var1._M_p = local_38._M_dataplus._M_p;
    break;
  case G_ROOM2_BUCKET:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"greenRoomTwo","");
    GreenRoomTwo::GreenRoomTwo((GreenRoomTwo *)this,&local_58,pTable,true);
    _Var1._M_p = local_58._M_dataplus._M_p;
    break;
  case G_ROOM3_BASIN:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"greenRoomThree","");
    GreenRoomThree::GreenRoomThree((GreenRoomThree *)this,&local_78,pTable,true);
    _Var1._M_p = local_78._M_dataplus._M_p;
    break;
  case G_ROOM4_KID:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"greenRoomFour","");
    GreenRoomFour::GreenRoomFour((GreenRoomFour *)this,&local_98,pTable,true);
    _Var1._M_p = local_98._M_dataplus._M_p;
    break;
  case W_ROOM1:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"whiteRoomOne","");
    WhiteRoomOne::WhiteRoomOne((WhiteRoomOne *)this,&local_d8,pTable,true);
    _Var1._M_p = local_d8._M_dataplus._M_p;
    break;
  case W_ROOM2:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"whiteRoomTwo","");
    WhiteRoomTwo::WhiteRoomTwo((WhiteRoomTwo *)this,&local_f8,pTable,true);
    _Var1._M_p = local_f8._M_dataplus._M_p;
    break;
  case W_ROOM3:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"whiteRoomThree","");
    WhiteRoomThree::WhiteRoomThree((WhiteRoomThree *)this,&local_118,pTable,true);
    _Var1._M_p = local_118._M_dataplus._M_p;
    break;
  case W_ROOM4:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_138.field_2;
    local_138._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"whiteRoomFour","");
    WhiteRoomFour::WhiteRoomFour((WhiteRoomFour *)this,&local_138,pTable,true);
    _Var1._M_p = local_138._M_dataplus._M_p;
    break;
  case W_ROOM5:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"whiteRoomFinal","");
    WhiteRoomFive::WhiteRoomFive((WhiteRoomFive *)this,&local_158,pTable,true);
    _Var1._M_p = local_158._M_dataplus._M_p;
    break;
  case B_ROOM1:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_178.field_2;
    local_178._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"blueRoomOne","");
    BlueRoomOne::BlueRoomOne((BlueRoomOne *)this,&local_178,pTable,true);
    _Var1._M_p = local_178._M_dataplus._M_p;
    break;
  case B_ROOM2:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_198.field_2;
    local_198._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"blueRoomTwo","");
    BlueRoomTwo::BlueRoomTwo((BlueRoomTwo *)this,&local_198,pTable,true);
    _Var1._M_p = local_198._M_dataplus._M_p;
    break;
  case B_ROOM3:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_1b8.field_2;
    local_1b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"blueRoomThree","");
    BlueRoomThree::BlueRoomThree((BlueRoomThree *)this,&local_1b8,pTable,true);
    _Var1._M_p = local_1b8._M_dataplus._M_p;
    break;
  case B_ROOM4:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_1d8.field_2;
    local_1d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"blueRoomFour","");
    BlueRoomFour::BlueRoomFour((BlueRoomFour *)this,&local_1d8,pTable,true);
    _Var1._M_p = local_1d8._M_dataplus._M_p;
    break;
  case B_ROOM5:
    this = (Room *)operator_new(0x138);
    paVar2 = &local_1f8.field_2;
    local_1f8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"blueRoomFinal","");
    BlueRoomFive::BlueRoomFive((BlueRoomFive *)this,&local_1f8,pTable,true);
    _Var1._M_p = local_1f8._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p);
  }
  return this;
}

Assistant:

Room *newRoomFactory(itemLocation location, ItemTable *pTable) {
    switch(location) {
        case G_ROOM1_SIDE1:
        case G_ROOM1_SIDE2:
            return new GreenRoomOne("greenRoomOne", pTable, true);
        case G_ROOM2_BUCKET :
            return new GreenRoomTwo("greenRoomTwo", pTable, true);
        case G_ROOM3_BASIN :
            return new GreenRoomThree("greenRoomThree", pTable, true);
        case G_ROOM4_KID :
            return new GreenRoomFour("greenRoomFour", pTable, true);
        case THREE_KEY_ROOM :
            return new ThreeKeyRoom("keyroom",pTable, true);
        case W_ROOM1 :
            return new WhiteRoomOne("whiteRoomOne", pTable, true);
        case W_ROOM2 :
            return new WhiteRoomTwo("whiteRoomTwo", pTable, true);
        case W_ROOM3 :
            return new WhiteRoomThree("whiteRoomThree", pTable, true);
        case W_ROOM4 :
            return new WhiteRoomFour("whiteRoomFour", pTable, true);
        case W_ROOM5 :
            return new WhiteRoomFive("whiteRoomFinal", pTable, true);
        case B_ROOM1 :
            return new BlueRoomOne("blueRoomOne", pTable, true);
        case B_ROOM2 :
            return new BlueRoomTwo("blueRoomTwo", pTable, true);
        case B_ROOM3 :
            return new BlueRoomThree("blueRoomThree", pTable, true);
        case B_ROOM4 :
            return new BlueRoomFour("blueRoomFour", pTable, true);
        case B_ROOM5 :
            return new BlueRoomFive("blueRoomFinal", pTable, true);
        default:
            assert(false);
            break;
    }
}